

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O1

void parse_body(LexState *ls,ExpDesc *e,int needself,BCLine line)

{
  uint8_t *puVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  FuncState *fs_00;
  FuncState *fs_01;
  FuncState *pFVar5;
  VarInfo *pVVar6;
  byte bVar7;
  BCPos BVar8;
  GCstr *pGVar9;
  GCobj *gc;
  uint uVar10;
  uint uVar11;
  BCReg BVar12;
  BCReg BVar13;
  ulong uVar14;
  FuncScope bl;
  FuncState fs;
  FuncScope local_410;
  FuncState local_400;
  
  fs_00 = ls->fs;
  uVar14 = (long)fs_00->bcbase - (long)ls->bcstack;
  fs_init(ls,&local_400);
  local_410.nactvar = (uint8_t)local_400.nactvar;
  local_410.flags = '\0';
  local_410.vstart = (local_400.ls)->vtop;
  local_410.prev = local_400.bl;
  fs_01 = ls->fs;
  local_400.bl = &local_410;
  local_400.linedefined = line;
  lex_check(ls,0x28);
  if (needself != 0) {
    pGVar9 = lj_parse_keepstr(ls,"self",4);
    var_new(ls,0,pGVar9);
  }
  BVar13 = (BCReg)(needself != 0);
  if (ls->tok != 0x29) {
    while( true ) {
      iVar4 = ls->tok;
      if ((iVar4 != 0x10a) && (iVar4 != 0x11f)) {
        if (iVar4 != 0x118) {
          err_syntax(ls,LJ_ERR_XPARAM);
        }
        lj_lex_next(ls);
        puVar1 = &fs_01->flags;
        *puVar1 = *puVar1 | 2;
        goto LAB_00121f48;
      }
      pGVar9 = lex_str(ls);
      var_new(ls,BVar13,pGVar9);
      if (ls->tok != 0x2c) break;
      lj_lex_next(ls);
      BVar13 = BVar13 + 1;
    }
    BVar13 = BVar13 + 1;
  }
LAB_00121f48:
  pFVar5 = ls->fs;
  uVar11 = pFVar5->nactvar;
  if (BVar13 != 0) {
    pVVar6 = ls->vstack;
    BVar8 = pFVar5->pc;
    uVar10 = uVar11;
    BVar12 = BVar13;
    do {
      uVar11 = uVar10 + 1;
      uVar3 = pFVar5->varmap[uVar10];
      pVVar6[uVar3].startpc = BVar8;
      pVVar6[uVar3].slot = (uint8_t)uVar10;
      pVVar6[uVar3].info = '\0';
      BVar12 = BVar12 - 1;
      uVar10 = uVar11;
    } while (BVar12 != 0);
  }
  pFVar5->nactvar = uVar11;
  bcreg_reserve(fs_01,BVar13);
  lex_check(ls,0x29);
  local_400.numparams = (uint8_t)BVar13;
  local_400.bcbase = fs_00->bcbase + fs_00->pc;
  local_400.bclim = fs_00->bclim - fs_00->pc;
  bcemit_INS(&local_400,0x59);
  parse_chunk(ls);
  if (ls->tok != 0x106) {
    lex_match(ls,0x106,0x109,line);
  }
  ls->lastline = ls->linenumber;
  gc = (GCobj *)fs_finish(ls,ls->linenumber);
  fs_00->bcbase = (BCInsLine *)(uVar14 + (long)ls->bcstack);
  fs_00->bclim = ls->sizebcstack - (int)(uVar14 >> 3);
  BVar13 = const_gc(fs_00,gc,0xfffffff8);
  BVar8 = bcemit_INS(fs_00,BVar13 * 0x10000 + 0x33);
  e->k = VRELOCABLE;
  (e->u).s.info = BVar8;
  e->t = 0xffffffff;
  e->f = 0xffffffff;
  bVar2 = fs_00->flags;
  bVar7 = local_400.flags & 4 | bVar2;
  fs_00->flags = bVar7;
  if ((bVar2 & 1) == 0) {
    if ((bVar2 & 0x20) != 0) {
      fs_00->flags = bVar7 | 0x40;
    }
    fs_00->flags = fs_00->flags | 1;
  }
  lj_lex_next(ls);
  return;
}

Assistant:

static void parse_body(LexState *ls, ExpDesc *e, int needself, BCLine line)
{
  FuncState fs, *pfs = ls->fs;
  FuncScope bl;
  GCproto *pt;
  ptrdiff_t oldbase = pfs->bcbase - ls->bcstack;
  fs_init(ls, &fs);
  fscope_begin(&fs, &bl, 0);
  fs.linedefined = line;
  fs.numparams = (uint8_t)parse_params(ls, needself);
  fs.bcbase = pfs->bcbase + pfs->pc;
  fs.bclim = pfs->bclim - pfs->pc;
  bcemit_AD(&fs, BC_FUNCF, 0, 0);  /* Placeholder. */
  parse_chunk(ls);
  if (ls->tok != TK_end) lex_match(ls, TK_end, TK_function, line);
  pt = fs_finish(ls, (ls->lastline = ls->linenumber));
  pfs->bcbase = ls->bcstack + oldbase;  /* May have been reallocated. */
  pfs->bclim = (BCPos)(ls->sizebcstack - oldbase);
  /* Store new prototype in the constant array of the parent. */
  expr_init(e, VRELOCABLE,
	    bcemit_AD(pfs, BC_FNEW, 0, const_gc(pfs, obj2gco(pt), LJ_TPROTO)));
#if LJ_HASFFI
  pfs->flags |= (fs.flags & PROTO_FFI);
#endif
  if (!(pfs->flags & PROTO_CHILD)) {
    if (pfs->flags & PROTO_HAS_RETURN)
      pfs->flags |= PROTO_FIXUP_RETURN;
    pfs->flags |= PROTO_CHILD;
  }
  lj_lex_next(ls);
}